

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::msgpack::
basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::visit_uint64(basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
               *this,uint64_t val,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  size_t *psVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer psVar2;
  ldiv_t lVar3;
  int iVar4;
  undefined7 in_register_00000011;
  uchar *__args;
  container_type *this_01;
  ldiv_t lVar6;
  ldiv_t lVar7;
  uchar local_1e [3];
  uchar local_1b [3];
  long lVar5;
  
  iVar4 = (int)CONCAT71(in_register_00000011,tag);
  if (iVar4 == 7) {
    if (val == 0) {
LAB_001d52c2:
      val = 0;
      goto LAB_001d52c7;
    }
    lVar7 = ldiv(val,1000000000);
    lVar6.rem = -lVar7.rem;
    lVar6.quot = lVar7.quot;
    if (lVar7.rem < 1) {
      lVar7 = lVar6;
    }
  }
  else if (iVar4 == 6) {
    if (val == 0) goto LAB_001d52c2;
    lVar6 = ldiv(val,1000);
    lVar5 = lVar6.rem;
    lVar3.rem = lVar5 * 1000000;
    lVar3.quot = lVar6.quot;
    lVar7.rem = lVar5 * -1000000;
    lVar7.quot = lVar6.quot;
    if (-1 < lVar5) {
      lVar7 = lVar3;
    }
  }
  else {
    if (iVar4 != 5) {
      if (val < 0x80) {
        this_01 = (this->sink_).buf_ptr;
        __args = local_1e;
      }
      else {
        if (0xff < val) {
          if (val < 0x10000) {
            local_1b[0] = 0xcd;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      ((this->sink_).buf_ptr,local_1b);
            binary::
            native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                      ((unsigned_short)val,
                       (back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        )&this->sink_);
          }
          else {
            this_00 = (this->sink_).buf_ptr;
            if (val >> 0x20 == 0) {
              local_1b[1] = 0xce;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(this_00,local_1b + 1);
              binary::
              native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                        ((uint)val,
                         (back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          )&this->sink_);
            }
            else {
              local_1b[2] = 0xcf;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(this_00,local_1b + 2);
              binary::
              native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                        (val,(back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              )&this->sink_);
            }
          }
          goto LAB_001d52ce;
        }
        local_1e[1] = 0xcc;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((this->sink_).buf_ptr,local_1e + 1);
        this_01 = (this->sink_).buf_ptr;
        __args = local_1e + 2;
      }
      *__args = (uchar)val;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (this_01,__args);
      goto LAB_001d52ce;
    }
LAB_001d52c7:
    lVar7.rem = 0;
    lVar7.quot = val;
  }
  write_timestamp(this,lVar7.quot,lVar7.rem);
LAB_001d52ce:
  psVar2 = (this->stack_).
           super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar2) {
    psVar1 = &psVar2[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t val, 
            semantic_tag tag, 
            const ser_context&,
            std::error_code&) final
        {
            switch (tag)
            {
                case semantic_tag::epoch_second:
                    write_timestamp(static_cast<int64_t>(val), 0);
                    break;
                case semantic_tag::epoch_milli:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(static_cast<int64_t>(val), static_cast<int64_t>(millis_in_second));
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem*nanos_in_milli;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                case semantic_tag::epoch_nano:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(static_cast<int64_t>(val), static_cast<int64_t>(nanos_in_second));
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                default:
                {
                    if (val <= static_cast<uint64_t>((std::numeric_limits<int8_t>::max)()))
                    {
                        // positive fixnum stores 7-bit positive integer
                        sink_.push_back(static_cast<uint8_t>(val));
                    }
                    else if (val <= (std::numeric_limits<uint8_t>::max)())
                    {
                        // uint 8 stores a 8-bit unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint8_type);
                        sink_.push_back(static_cast<uint8_t>(val));
                    }
                    else if (val <= (std::numeric_limits<uint16_t>::max)())
                    {
                        // uint 16 stores a 16-bit big-endian unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint16_type);
                        binary::native_to_big(static_cast<uint16_t>(val),std::back_inserter(sink_));
                    }
                    else if (val <= (std::numeric_limits<uint32_t>::max)())
                    {
                        // uint 32 stores a 32-bit big-endian unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint32_type);
                        binary::native_to_big(static_cast<uint32_t>(val),std::back_inserter(sink_));
                    }
                    else if (val <= (std::numeric_limits<uint64_t>::max)())
                    {
                        // uint 64 stores a 64-bit big-endian unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint64_type);
                        binary::native_to_big(static_cast<uint64_t>(val),std::back_inserter(sink_));
                    }
                    break;
                }
            }
            end_value();
            JSONCONS_VISITOR_RETURN;
        }